

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setDateRange(QDateTimeEdit *this,QDate min,QDate max)

{
  bool bVar1;
  QDateTimeEditPrivate *this_00;
  qint64 in_RDX;
  QDateTimeEdit *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  QDateTimeEditPrivate *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QTime time;
  QDate in_stack_ffffffffffffffc8;
  QDateTime *in_stack_ffffffffffffffd0;
  QDateTime local_20 [8];
  qint64 local_18;
  QDateTimeEdit *local_10;
  long local_8;
  
  time.mds = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RDX;
  local_10 = in_RSI;
  this_00 = d_func((QDateTimeEdit *)0x558214);
  bVar1 = QDate::isValid((QDate *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if ((bVar1) &&
     (bVar1 = QDate::isValid((QDate *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
     , bVar1)) {
    ::QVariant::toTime();
    QDateTimeEditPrivate::dateTimeValue(in_stack_ffffffffffffffa0,in_stack_ffffffffffffffc8,time);
    ::QVariant::toTime();
    QDateTimeEditPrivate::dateTimeValue(this_00,(QDate)local_18,time);
    setDateTimeRange(local_10,in_stack_ffffffffffffffd0,(QDateTime *)local_18);
    QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffd0);
    QDateTime::~QDateTime(local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setDateRange(QDate min, QDate max)
{
    Q_D(QDateTimeEdit);
    if (min.isValid() && max.isValid()) {
        setDateTimeRange(d->dateTimeValue(min, d->minimum.toTime()),
                         d->dateTimeValue(max, d->maximum.toTime()));
    }
}